

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_schnorrsig.cpp
# Opt level: O0

void __thiscall cfd::core::SchnorrPubkey::SchnorrPubkey(SchnorrPubkey *this,ByteData256 *data)

{
  CfdException *this_00;
  bool bVar1;
  allocator local_49;
  string local_48;
  ByteData256 *local_18;
  ByteData256 *data_local;
  SchnorrPubkey *this_local;
  
  local_18 = data;
  data_local = &this->data_;
  ByteData256::ByteData256(&this->data_,data);
  bVar1 = ByteData256::IsEmpty(local_18);
  if (!bVar1) {
    return;
  }
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_48,"Invalid Schnorr pubkey data.",&local_49);
  CfdException::CfdException(this_00,kCfdIllegalArgumentError,&local_48);
  __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

SchnorrPubkey::SchnorrPubkey(const ByteData256 &data) : data_(data) {
  if (data.IsEmpty()) {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Invalid Schnorr pubkey data.");
  }
}